

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

Vec_Ptr_t * Bac_PtrTransformSigs(Vec_Ptr_t *vSig)

{
  int iVar1;
  Vec_Ptr_t *p;
  char *pcVar2;
  Vec_Ptr_t *vNew;
  int i;
  char *pName;
  Vec_Ptr_t *vSig_local;
  
  iVar1 = Vec_PtrSize(vSig);
  p = Vec_PtrAllocExact(iVar1);
  for (vNew._4_4_ = 0; iVar1 = Vec_PtrSize(vSig), vNew._4_4_ < iVar1; vNew._4_4_ = vNew._4_4_ + 1) {
    pcVar2 = (char *)Vec_PtrEntry(vSig,vNew._4_4_);
    pcVar2 = Abc_UtilStrsav(pcVar2);
    Vec_PtrPush(p,pcVar2);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformSigs( Vec_Ptr_t * vSig )
{
    char * pName; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vSig) );
    Vec_PtrForEachEntry( char *, vSig, pName, i )
        Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    return vNew;
}